

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int bitstream_r_memcpy(bitstream_r *stream,void *dst,size_t bytes)

{
  int iVar1;
  ulong uVar2;
  
  if ((stream->bit_offset & 7) != 0) {
    stream->bit_offset = (stream->bit_offset & 0xfffffffffffffff8) + 8;
  }
  uVar2 = stream->bit_offset >> 3;
  iVar1 = -1;
  if (uVar2 + bytes <= stream->length) {
    memcpy(dst,(void *)(uVar2 + (long)stream->ptr),bytes);
    stream->bit_offset = stream->bit_offset + bytes * 8;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
bitstream_r_memcpy(struct bitstream_r *stream, void *dst, size_t bytes) {
  const uint8_t *buffer;
  size_t offset;
  bitstream_r_pad(stream);

  offset = stream->bit_offset / 8;
  if (offset + bytes > stream->length) {
    return -1;
  }

  buffer = stream->ptr;
  memcpy(dst, &buffer[offset], bytes);

  stream->bit_offset += bytes * 8;
  return 0;
}